

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ft_font_renderer.cpp
# Opt level: O1

void __thiscall FtFontRenderer::FtFontRenderer(FtFontRenderer *this,FontRendererArgs *args)

{
  FT_Face_conflict *ppFVar1;
  int iVar2;
  runtime_error *prVar3;
  string local_60;
  string local_40;
  
  (this->super_FontRenderer)._vptr_FontRenderer = (_func_int **)&PTR__FtFontRenderer_00127870;
  refLib();
  ppFVar1 = &this->face;
  iVar2 = FT_New_Memory_Face(library,args->data,args->dataSize,0,ppFVar1);
  if (iVar2 != 0) {
    unrefLib();
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    ftErrorToStr_abi_cxx11_(&local_40,iVar2);
    dpfb::str::format_abi_cxx11_(&local_60,"Can\'t open font: %s",local_40._M_dataplus._M_p);
    std::runtime_error::runtime_error(prVar3,(string *)&local_60);
    *(undefined ***)prVar3 = &PTR__runtime_error_00127848;
    __cxa_throw(prVar3,&dpfb::FontRendererError::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((*ppFVar1)->charmap != (FT_CharMap)0x0) {
    iVar2 = FT_Set_Char_Size(*ppFVar1,(long)args->pxSize << 6,0,0x48,0);
    if (iVar2 == 0) {
      this->loadFlags = 0;
      this->loadFlags = (uint)(args->hinting == light) << 0x10;
      return;
    }
    FT_Done_Face(*ppFVar1);
    unrefLib();
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    ftErrorToStr_abi_cxx11_(&local_60,iVar2);
    std::runtime_error::runtime_error(prVar3,(string *)&local_60);
    *(undefined ***)prVar3 = &PTR__runtime_error_00127848;
    __cxa_throw(prVar3,&dpfb::FontRendererError::typeinfo,std::runtime_error::~runtime_error);
  }
  FT_Done_Face();
  unrefLib();
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"Font doesn\'t contain Unicode charmap");
  *(undefined ***)prVar3 = &PTR__runtime_error_00127848;
  __cxa_throw(prVar3,&dpfb::FontRendererError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FtFontRenderer::FtFontRenderer(const dpfb::FontRendererArgs& args)
{
    refLib();

    auto err = FT_New_Memory_Face(
        library, args.data, args.dataSize, 0, &face);
    if (err != FT_Err_Ok) {
        unrefLib();
        throw dpfb::FontRendererError(
            dpfb::str::format(
                "Can't open font: %s", ftErrorToStr(err).c_str()));
    }

    if (!face->charmap) {
        FT_Done_Face(face);
        unrefLib();
        throw dpfb::FontRendererError(
            "Font doesn't contain Unicode charmap");
    }

    err = FT_Set_Char_Size(face, args.pxSize * 64, 0, 72, 0);
    if (err != FT_Err_Ok) {
        FT_Done_Face(face);
        unrefLib();
        throw dpfb::FontRendererError(ftErrorToStr(err));
    }

    loadFlags = FT_LOAD_DEFAULT;
    if (args.hinting == dpfb::Hinting::light)
        loadFlags |= FT_LOAD_TARGET_LIGHT;
}